

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O0

FT_Error afm_parser_init(AFM_Parser parser,FT_Memory memory,FT_Byte *base,FT_Byte *limit)

{
  FT_Alloc_Func p_Var1;
  int local_3c [2];
  FT_Error error;
  AFM_Stream stream;
  FT_Byte *limit_local;
  FT_Byte *base_local;
  FT_Memory memory_local;
  AFM_Parser parser_local;
  
  stack0xffffffffffffffc8 = 0;
  stream = (AFM_Stream)limit;
  limit_local = base;
  base_local = (FT_Byte *)memory;
  memory_local = (FT_Memory)parser;
  p_Var1 = (FT_Alloc_Func)ft_mem_alloc(memory,0x20,local_3c);
  if (local_3c[0] == 0) {
    *(FT_Byte **)(p_Var1 + 8) = limit_local;
    *(FT_Byte **)p_Var1 = limit_local;
    *(AFM_Stream *)(p_Var1 + 0x10) = stream;
    *(undefined4 *)(p_Var1 + 0x18) = 2;
    memory_local->user = base_local;
    memory_local->alloc = p_Var1;
    memory_local->free = (FT_Free_Func)0x0;
    memory_local->realloc = (FT_Realloc_Func)0x0;
    parser_local._4_4_ = 0;
  }
  else {
    parser_local._4_4_ = local_3c[0];
  }
  return parser_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_init( AFM_Parser  parser,
                   FT_Memory   memory,
                   FT_Byte*    base,
                   FT_Byte*    limit )
  {
    AFM_Stream  stream = NULL;
    FT_Error    error;


    if ( FT_NEW( stream ) )
      return error;

    stream->cursor = stream->base = base;
    stream->limit  = limit;

    /* don't skip the first line during the first call */
    stream->status = AFM_STREAM_STATUS_EOL;

    parser->memory    = memory;
    parser->stream    = stream;
    parser->FontInfo  = NULL;
    parser->get_index = NULL;

    return FT_Err_Ok;
  }